

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

float * ma_dr_mp3__full_read_and_close_f32
                  (ma_dr_mp3 *pMP3,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount)

{
  uint uVar1;
  void *p;
  float *pfVar2;
  long *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  float *pNewFrames;
  ma_uint64 newFramesCap;
  ma_uint64 newFramesBufferSize;
  ma_uint64 oldFramesBufferSize;
  ma_uint64 framesJustRead;
  ma_uint64 framesToReadRightNow;
  float temp [4096];
  float *pFrames;
  ma_uint64 framesCapacity;
  ma_uint64 totalFramesRead;
  ma_dr_mp3 *in_stack_ffffffffffffbfa0;
  undefined1 local_4038 [16368];
  float *in_stack_ffffffffffffffb8;
  ma_uint64 in_stack_ffffffffffffffc0;
  ma_dr_mp3 *in_stack_ffffffffffffffc8;
  float *local_30;
  ma_dr_mp3 *local_28;
  long local_20;
  
  local_20 = 0;
  local_28 = (ma_dr_mp3 *)0x0;
  local_30 = (float *)0x0;
  do {
    uVar1 = *(uint *)(in_RDI + 0x1a0c);
    p = (void *)ma_dr_mp3_read_pcm_frames_f32
                          (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8);
    if (p == (void *)0x0) break;
    pfVar2 = local_30;
    if (local_28 < (ma_dr_mp3 *)(local_20 + (long)p)) {
      in_stack_ffffffffffffbfa0 = (ma_dr_mp3 *)((long)local_28 << 1);
      if (in_stack_ffffffffffffbfa0 < (ma_dr_mp3 *)(local_20 + (long)p)) {
        in_stack_ffffffffffffbfa0 = (ma_dr_mp3 *)(local_20 + (long)p);
      }
      pfVar2 = (float *)ma_dr_mp3__realloc_from_callbacks
                                  (p,(long)local_28 * (ulong)*(uint *)(in_RDI + 0x1a0c) * 4,
                                   (long)in_stack_ffffffffffffbfa0 *
                                   (ulong)*(uint *)(in_RDI + 0x1a0c) * 4,
                                   (ma_allocation_callbacks *)in_stack_ffffffffffffbfa0);
      local_28 = in_stack_ffffffffffffbfa0;
      if (pfVar2 == (float *)0x0) {
        ma_dr_mp3__free_from_callbacks(in_stack_ffffffffffffbfa0,(ma_allocation_callbacks *)0x0);
        break;
      }
    }
    local_30 = pfVar2;
    memcpy(local_30 + local_20 * (ulong)*(uint *)(in_RDI + 0x1a0c),local_4038,
           (long)p * (ulong)*(uint *)(in_RDI + 0x1a0c) * 4);
    local_20 = (long)p + local_20;
  } while (p == SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(uVar1),0));
  if (in_RSI != (undefined4 *)0x0) {
    *in_RSI = *(undefined4 *)(in_RDI + 0x1a0c);
    in_RSI[1] = *(undefined4 *)(in_RDI + 0x1a10);
  }
  ma_dr_mp3_uninit(in_stack_ffffffffffffbfa0);
  if (in_RDX != (long *)0x0) {
    *in_RDX = local_20;
  }
  return local_30;
}

Assistant:

static float* ma_dr_mp3__full_read_and_close_f32(ma_dr_mp3* pMP3, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint64 framesCapacity = 0;
    float* pFrames = NULL;
    float temp[4096];
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    for (;;) {
        ma_uint64 framesToReadRightNow = MA_DR_MP3_COUNTOF(temp) / pMP3->channels;
        ma_uint64 framesJustRead = ma_dr_mp3_read_pcm_frames_f32(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }
        if (framesCapacity < totalFramesRead + framesJustRead) {
            ma_uint64 oldFramesBufferSize;
            ma_uint64 newFramesBufferSize;
            ma_uint64 newFramesCap;
            float* pNewFrames;
            newFramesCap = framesCapacity * 2;
            if (newFramesCap < totalFramesRead + framesJustRead) {
                newFramesCap = totalFramesRead + framesJustRead;
            }
            oldFramesBufferSize = framesCapacity * pMP3->channels * sizeof(float);
            newFramesBufferSize = newFramesCap   * pMP3->channels * sizeof(float);
            if (newFramesBufferSize > (ma_uint64)MA_SIZE_MAX) {
                break;
            }
            pNewFrames = (float*)ma_dr_mp3__realloc_from_callbacks(pFrames, (size_t)newFramesBufferSize, (size_t)oldFramesBufferSize, &pMP3->allocationCallbacks);
            if (pNewFrames == NULL) {
                ma_dr_mp3__free_from_callbacks(pFrames, &pMP3->allocationCallbacks);
                break;
            }
            pFrames = pNewFrames;
            framesCapacity = newFramesCap;
        }
        MA_DR_MP3_COPY_MEMORY(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(float)));
        totalFramesRead += framesJustRead;
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }
    if (pConfig != NULL) {
        pConfig->channels   = pMP3->channels;
        pConfig->sampleRate = pMP3->sampleRate;
    }
    ma_dr_mp3_uninit(pMP3);
    if (pTotalFrameCount) {
        *pTotalFrameCount = totalFramesRead;
    }
    return pFrames;
}